

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O1

bool AString_replaceAString(AString *str,AString *old,AString *rep,size_t count)

{
  bool bVar1;
  
  if (old == (AString *)0x0) {
    return false;
  }
  if (rep != (AString *)0x0) {
    bVar1 = AString_replaceCString(str,old->buffer,old->size,rep->buffer,rep->size,count);
    return bVar1;
  }
  bVar1 = AString_replaceCString(str,old->buffer,old->size,(char *)0x0,0,count);
  return bVar1;
}

Assistant:

ACUTILS_HD_FUNC bool AString_replaceAString(struct AString *str, const struct AString *old, const struct AString *rep, size_t count)
{
    if(old == nullptr)
        return false;
    else if(rep == nullptr)
        return AString_replaceCString(str, old->buffer, old->size, nullptr, 0, count);
    else
        return AString_replaceCString(str, old->buffer, old->size, rep->buffer, rep->size, count);
}